

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>::
MatchAndExplain<pstore::small_vector<unsigned_char,128ul>>
          (ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>> *this,
          small_vector<unsigned_char,_128UL> *lhs,MatchResultListener *listener)

{
  ostream *os;
  bool bVar1;
  uchar *puVar2;
  pointer_based_iterator<const_unsigned_char> pVar3;
  ostream *poVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  uchar *elem;
  const_iterator it;
  pointer_based_iterator<const_unsigned_char> elem_00;
  
  bVar1 = pstore::operator==(lhs,(small_vector<unsigned_char,_128UL> *)this);
  if ((!bVar1) && (os = listener->stream_, os != (ostream *)0x0)) {
    bVar5 = false;
    puVar2 = lhs->buffer_;
    for (elem = puVar2; pVar3.pos_ = *(pointer *)(this + 0xa0), elem != puVar2 + lhs->elements_;
        elem = elem + 1) {
      pVar3 = ArrayAwareFind<pstore::pointer_based_iterator<unsigned_char_const>,unsigned_char>
                        (pVar3,pVar3.pos_ + *(long *)this,elem);
      if (pVar3.pos_ == (pointer)(*(long *)(this + 0xa0) + *(long *)this)) {
        pcVar6 = "which has these unexpected elements: ";
        if (bVar5) {
          pcVar6 = ", ";
        }
        else {
          bVar5 = true;
        }
        std::operator<<(os,pcVar6);
        UniversalPrinter<unsigned_char>::Print(elem,os);
      }
      puVar2 = lhs->buffer_;
    }
    pcVar6 = "which";
    if (bVar5) {
      pcVar6 = ",\nand";
    }
    bVar5 = false;
    for (elem_00.pos_ = pVar3.pos_; elem_00.pos_ != pVar3.pos_ + *(long *)this;
        elem_00.pos_ = elem_00.pos_ + 1) {
      pVar3 = ArrayAwareFind<pstore::pointer_based_iterator<unsigned_char_const>,unsigned_char>
                        ((pointer_based_iterator<const_unsigned_char>)lhs->buffer_,
                         (pointer_based_iterator<const_unsigned_char>)
                         (lhs->buffer_ + lhs->elements_),elem_00.pos_);
      if (pVar3.pos_ == lhs->buffer_ + lhs->elements_) {
        if (bVar5) {
          pcVar7 = ", ";
          poVar4 = os;
        }
        else {
          poVar4 = std::operator<<(os,pcVar6);
          pcVar7 = " doesn\'t have these expected elements: ";
        }
        std::operator<<(poVar4,pcVar7);
        UniversalPrinter<unsigned_char>::Print(elem_00.pos_,os);
        bVar5 = true;
      }
      pVar3.pos_ = *(pointer *)(this + 0xa0);
    }
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }